

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O1

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  stbrp_rect *psVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  undefined1 auVar5 [16];
  stbrp_node **ppsVar6;
  stbrp_context *psVar7;
  int iVar8;
  ulong uVar9;
  undefined8 uVar10;
  long extraout_RAX;
  long lVar11;
  int *piVar12;
  int iVar13;
  undefined4 in_register_00000014;
  ulong uVar14;
  stbrp_context *psVar15;
  stbrp_node **ppsVar16;
  stbrp_node *psVar17;
  stbrp_node *psVar18;
  stbrp_node **in_R8;
  stbrp_node *psVar19;
  int iVar20;
  uint uVar21;
  stbrp_context *c;
  int iVar22;
  ulong uVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int waste;
  int local_a8;
  uint local_a4;
  stbrp_node **local_a0;
  int local_90;
  int local_8c;
  stbrp_context *local_88;
  ulong local_80;
  undefined8 local_78;
  stbrp_node **local_70;
  stbrp_node *local_68;
  ulong local_60;
  stbrp_rect *local_58;
  ulong local_50;
  size_t local_48;
  ulong local_40;
  stbrp_rect *local_38;
  
  auVar5 = _DAT_001811f0;
  local_78 = CONCAT44(in_register_00000014,num_rects);
  uVar23 = (ulong)(uint)num_rects;
  if (0 < num_rects) {
    lVar11 = uVar23 - 1;
    auVar25._8_4_ = (int)lVar11;
    auVar25._0_8_ = lVar11;
    auVar25._12_4_ = (int)((ulong)lVar11 >> 0x20);
    piVar12 = &rects[1].was_packed;
    uVar14 = 0;
    auVar25 = auVar25 ^ _DAT_001811f0;
    auVar26 = _DAT_001811e0;
    do {
      auVar27 = auVar26 ^ auVar5;
      if ((bool)(~(auVar27._4_4_ == auVar25._4_4_ && auVar25._0_4_ < auVar27._0_4_ ||
                  auVar25._4_4_ < auVar27._4_4_) & 1)) {
        piVar12[-4] = (int)uVar14;
      }
      if ((auVar27._12_4_ != auVar25._12_4_ || auVar27._8_4_ <= auVar25._8_4_) &&
          auVar27._12_4_ <= auVar25._12_4_) {
        *piVar12 = (int)uVar14 + 1;
      }
      uVar14 = uVar14 + 2;
      lVar11 = auVar26._8_8_;
      auVar26._0_8_ = auVar26._0_8_ + 2;
      auVar26._8_8_ = lVar11 + 2;
      piVar12 = piVar12 + 8;
    } while ((num_rects + 1U & 0xfffffffe) != uVar14);
  }
  local_48 = (size_t)num_rects;
  qsort(rects,local_48,0x10,rect_height_compare);
  if (0 < num_rects) {
    ppsVar16 = &context->active_head;
    uVar14 = 0;
    local_88 = context;
    local_70 = ppsVar16;
    local_40 = uVar23;
    local_38 = rects;
    do {
      psVar1 = rects + uVar14;
      uVar2 = rects[uVar14].w;
      uVar9 = (ulong)uVar2;
      if (uVar2 == 0) {
LAB_00142642:
        psVar1->x = 0;
        psVar1->y = 0;
        local_a0 = in_R8;
      }
      else {
        uVar3 = psVar1->h;
        local_80 = (ulong)uVar3;
        if (uVar3 == 0) goto LAB_00142642;
        iVar13 = context->width;
        iVar20 = (uint)uVar2 + context->align + -1;
        iVar20 = iVar20 - iVar20 % context->align;
        local_60 = uVar9;
        local_58 = psVar1;
        local_50 = uVar14;
        if (iVar13 < iVar20) {
LAB_00142638:
          local_a0 = (stbrp_node **)0x0;
          uVar10 = 0;
        }
        else {
          iVar4 = context->height;
          local_80._0_4_ = (uint)uVar3;
          if (iVar4 < (int)(uint)local_80) goto LAB_00142638;
          c = (stbrp_context *)*ppsVar16;
          uVar2 = (ushort)c->width;
          psVar17 = (stbrp_node *)(ulong)uVar2;
          local_68 = psVar17;
          if (iVar13 < (int)(iVar20 + (uint)uVar2)) {
            local_a8 = 0x40000000;
            iVar22 = 0x40000000;
            local_a0 = (stbrp_node **)0x0;
          }
          else {
            iVar22 = 0x40000000;
            local_a0 = (stbrp_node **)0x0;
            local_a8 = 0x40000000;
            psVar15 = c;
            do {
              iVar8 = stbrp__skyline_find_min_y(psVar15,psVar17,iVar20,(int)&local_8c,(int *)in_R8);
              if (local_88->heuristic == 0) {
                if (iVar8 < iVar22) {
                  local_a0 = ppsVar16;
                  iVar22 = iVar8;
                }
              }
              else if (((int)local_80 + iVar8 <= iVar4) &&
                      ((iVar8 < iVar22 || ((iVar8 == iVar22 && (local_8c < local_a8)))))) {
                local_a8 = local_8c;
                local_a0 = ppsVar16;
                iVar22 = iVar8;
              }
              ppsVar16 = (stbrp_node **)&psVar15->align;
              uVar2 = (ushort)(*(stbrp_context **)&psVar15->align)->width;
              psVar17 = (stbrp_node *)(ulong)uVar2;
              psVar15 = *(stbrp_context **)&psVar15->align;
            } while ((int)(iVar20 + (uint)uVar2) <= iVar13);
          }
          if (local_a0 == (stbrp_node **)0x0) {
            local_a4 = 0;
          }
          else {
            local_a4 = (uint)(*local_a0)->x;
          }
          if (local_88->heuristic == 1) {
            uVar21 = (uint)local_68;
            psVar15 = c;
            while (ppsVar16 = local_70, (int)uVar21 < iVar20) {
              psVar15 = *(stbrp_context **)&psVar15->align;
              uVar21 = (uint)(ushort)psVar15->width;
            }
            do {
              uVar21 = (uint)(ushort)psVar15->width - iVar20;
              ppsVar6 = ppsVar16;
              psVar7 = c;
              do {
                c = psVar7;
                ppsVar16 = ppsVar6;
                ppsVar6 = (stbrp_node **)&c->align;
                psVar7 = *(stbrp_context **)&c->align;
              } while ((int)(uint)(ushort)(*(stbrp_context **)&c->align)->width <= (int)uVar21);
              iVar13 = stbrp__skyline_find_min_y
                                 (c,(stbrp_node *)(ulong)uVar21,iVar20,(int)&local_90,(int *)in_R8);
              if ((((int)local_80 + iVar13 <= iVar4) && (iVar13 <= iVar22)) &&
                 (((iVar13 < iVar22 || (local_90 < local_a8)) ||
                  ((local_90 == local_a8 && ((int)uVar21 < (int)local_a4)))))) {
                local_a8 = local_90;
                local_a4 = uVar21;
                local_a0 = ppsVar16;
                iVar22 = iVar13;
              }
              psVar15 = *(stbrp_context **)&psVar15->align;
            } while (psVar15 != (stbrp_context *)0x0);
          }
          uVar10 = CONCAT44(iVar22,local_a4);
          ppsVar16 = local_70;
          context = local_88;
          rects = local_38;
          uVar23 = local_40;
        }
        uVar14 = local_50;
        if (((local_a0 == (stbrp_node **)0x0) ||
            (iVar13 = (int)local_80 + (int)((ulong)uVar10 >> 0x20), context->height < iVar13)) ||
           (psVar17 = context->free_head, psVar17 == (stbrp_node *)0x0)) {
          local_58->x = 0xffff;
          local_58->y = 0xffff;
        }
        else {
          psVar17->x = (stbrp_coord)uVar10;
          psVar17->y = (stbrp_coord)iVar13;
          context->free_head = psVar17->next;
          psVar19 = *local_a0;
          iVar13 = (int)uVar10;
          psVar18 = psVar19;
          if ((int)(uint)psVar19->x < iVar13) {
            psVar18 = psVar19->next;
            local_a0 = &psVar19->next;
          }
          *local_a0 = psVar17;
          if (psVar18->next != (stbrp_node *)0x0) {
            local_a0 = &psVar18->next;
            psVar19 = psVar18->next;
            do {
              if (iVar13 + (int)local_60 < (int)(uint)psVar19->x) break;
              *local_a0 = context->free_head;
              context->free_head = psVar18;
              local_a0 = &psVar19->next;
              ppsVar6 = &psVar19->next;
              psVar18 = psVar19;
              psVar19 = *ppsVar6;
            } while (*ppsVar6 != (stbrp_node *)0x0);
          }
          psVar17->next = psVar18;
          iVar13 = (int)local_60 + iVar13;
          if ((int)(uint)psVar18->x < iVar13) {
            psVar18->x = (stbrp_coord)iVar13;
          }
          local_58->x = (stbrp_coord)uVar10;
          local_58->y = (stbrp_coord)((ulong)uVar10 >> 0x20);
        }
      }
      uVar14 = uVar14 + 1;
      in_R8 = local_a0;
    } while (uVar14 != uVar23);
  }
  qsort(rects,local_48,0x10,rect_original_order);
  lVar11 = extraout_RAX;
  if (0 < (int)local_78) {
    lVar11 = 0;
    do {
      bVar24 = true;
      if (*(short *)((long)&rects->x + lVar11) == -1) {
        bVar24 = *(short *)((long)&rects->y + lVar11) != -1;
      }
      *(uint *)((long)&rects->was_packed + lVar11) = (uint)bVar24;
      lVar11 = lVar11 + 0x10;
    } while (uVar23 * 0x10 != lVar11);
  }
  return (int)lVar11;
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}